

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

void helics::addFields(string_view key,string_view typeName,InterfaceHandle hid,MapType *searchMap,
                      AliasT *aliases)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer ppVar3;
  runtime_error *this;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>,_bool>
  pVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string_view<char,_std::char_traits<char>_> *alias;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  iterator aliasRange;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>,_bool>
  placed;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
  *in_stack_fffffffffffffd78;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_fffffffffffffd80;
  reference __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  InterfaceHandle *in_stack_fffffffffffffd90;
  key_type *in_stack_fffffffffffffd98;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
  *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_231 [6];
  string local_160 [32];
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  local_140;
  undefined1 local_138;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>,_bool>
  local_130;
  reference local_120;
  basic_string_view<char,_std::char_traits<char>_> *local_118;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_110;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_108;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
  local_100;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
  local_f8;
  undefined1 local_ea;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b1 [2];
  string local_70 [32];
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  local_50;
  undefined1 local_48;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>,_bool>
  local_40 [4];
  
  pVar4 = std::
          unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceHandle,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>>
          ::try_emplace<helics::InterfaceHandle&>
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  local_50._M_cur =
       (__node_type *)
       pVar4.first.
       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
       ._M_cur;
  local_48 = pVar4.second;
  local_40[0].first.
  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
             )(_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
               )local_50._M_cur;
  local_40[0].second = (bool)local_48;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_ea = 1;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x10);
    pbVar5 = local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_00000008,(char *)pbVar5,(allocator<char> *)pbVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_00000008,(basic_string_view<char,_std::char_traits<char>_> *)pbVar5,
               (allocator<char> *)pbVar2);
    std::operator+(pbVar5,pbVar2);
    std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
    std::runtime_error::runtime_error((runtime_error *)pbVar2,local_70);
    local_ea = 0;
    __cxa_throw(pbVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_f8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
       ::find(in_stack_fffffffffffffd78,(key_type *)0x642b2e);
  local_100._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
       ::end(in_stack_fffffffffffffd78);
  bVar1 = CLI::std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
                      *)&local_f8,
                     (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
                      *)&local_100);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_false,_true>
                           *)0x642b75);
    local_108 = &ppVar3->second;
    local_110._M_current =
         (basic_string_view<char,_std::char_traits<char>_> *)
         CLI::std::
         vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)in_stack_fffffffffffffd78);
    local_118 = (basic_string_view<char,_std::char_traits<char>_> *)
                CLI::std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)in_stack_fffffffffffffd78);
    pbVar5 = in_stack_00000008;
    while (bVar1 = __gnu_cxx::
                   operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             (in_stack_fffffffffffffd80,
                              (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)in_stack_fffffffffffffd78), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_120 = __gnu_cxx::
                  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  ::operator*(&local_110);
      pVar4 = std::
              unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceHandle,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>>
              ::try_emplace<helics::InterfaceHandle&>
                        (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         in_stack_fffffffffffffd90);
      local_140._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
           ._M_cur;
      local_138 = pVar4.second;
      local_130.first.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                 )(_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                   )local_140._M_cur;
      local_130.second = (bool)local_138;
      std::
      pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>,_bool>
      ::operator=(local_40,&local_130);
      if ((local_40[0].second & 1U) == 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (pbVar5,(char *)in_stack_fffffffffffffdb8,
                   (allocator<char> *)in_stack_fffffffffffffdb0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (pbVar5,(basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_fffffffffffffdb8,(allocator<char> *)in_stack_fffffffffffffdb0);
        std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
        pbVar2 = local_231;
        __rhs = local_120;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (pbVar5,(basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_fffffffffffffdb8,(allocator<char> *)in_stack_fffffffffffffdb0);
        std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        std::operator+(pbVar2,(char *)__rhs);
        std::runtime_error::runtime_error(this,local_160);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&local_110);
    }
  }
  return;
}

Assistant:

static void addFields(std::string_view key,
                      std::string_view typeName,
                      InterfaceHandle hid,
                      MapType& searchMap,
                      AliasT aliases)
{
    auto placed = searchMap.try_emplace(key, hid);
    if (!placed.second) {
        throw std::runtime_error(std::string("duplicate ") + std::string(typeName) + " key found");
    }
    auto aliasRange = aliases.find(key);
    if (aliasRange != aliases.end()) {
        for (auto& alias : aliasRange->second) {
            placed = searchMap.try_emplace(alias, hid);
            if (!placed.second) {
                throw std::runtime_error(std::string("duplicate ") + std::string(typeName) +
                                         " alias key(" + std::string(alias) + ") found");
            }
        }
    }
}